

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindProgramCommand.cxx
# Opt level: O0

void __thiscall
cmFindProgramHelper::cmFindProgramHelper
          (cmFindProgramHelper *this,string *debugName,cmMakefile *makefile,cmFindBase *base)

{
  PolicyStatus PVar1;
  string local_48;
  cmFindBase *local_28;
  cmFindBase *base_local;
  cmMakefile *makefile_local;
  string *debugName_local;
  cmFindProgramHelper *this_local;
  
  local_28 = base;
  base_local = (cmFindBase *)makefile;
  makefile_local = (cmMakefile *)debugName;
  debugName_local = (string *)this;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Extensions);
  std::__cxx11::string::string((string *)&this->BestPath);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Names);
  std::__cxx11::string::string((string *)&this->TestNameExt);
  std::__cxx11::string::string((string *)&this->TestPath);
  std::__cxx11::string::string((string *)&local_48,(string *)debugName);
  cmFindBaseDebugState::cmFindBaseDebugState(&this->DebugSearches,&local_48,local_28);
  std::__cxx11::string::~string((string *)&local_48);
  this->Makefile = (cmMakefile *)base_local;
  this->FindBase = local_28;
  PVar1 = cmMakefile::GetPolicyStatus((cmMakefile *)base_local,CMP0109,false);
  this->PolicyCMP0109 = PVar1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::emplace_back<>(&this->Extensions);
  return;
}

Assistant:

cmFindProgramHelper(std::string debugName, cmMakefile* makefile,
                      cmFindBase const* base)
    : DebugSearches(std::move(debugName), base)
    , Makefile(makefile)
    , FindBase(base)
    , PolicyCMP0109(makefile->GetPolicyStatus(cmPolicies::CMP0109))
  {
#if defined(_WIN32) || defined(__CYGWIN__) || defined(__MINGW32__)
    // Consider platform-specific extensions.
    this->Extensions.push_back(".com");
    this->Extensions.push_back(".exe");
#endif
    // Consider original name with no extensions.
    this->Extensions.emplace_back();
  }